

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_spline::SetupData
          (ChFunctionRotation_spline *this,int morder,
          vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
          *mrotations,ChVectorDynamic<> *mknots)

{
  ulong uVar1;
  ChException *pCVar2;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  if (morder < 1) {
    pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_38,"ChFunctionRotation_spline::SetupData requires order >= 1.",
               &local_79);
    ChException::ChException(pCVar2,&local_38);
    __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
  }
  uVar1 = (long)(mrotations->
                super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(mrotations->
                super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (morder + 1 <= uVar1) {
    if ((mknots != (ChVectorDynamic<> *)0x0) &&
       ((mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        uVar1 + (morder + 1))) {
      pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_78,
                 "ChFunctionRotation_spline::SetupData: knots must have size=n_points+order+1",
                 &local_79);
      ChException::ChException(pCVar2,&local_78);
      __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
    }
    this->p = morder;
    std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
    operator=(&this->rotations,mrotations);
    if (mknots != (ChVectorDynamic<> *)0x0) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&this->knots,mknots);
      return;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(this->p + 1 +
                     (int)((ulong)((long)(this->rotations).
                                         super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->rotations).
                                        super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5)));
    geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(&this->knots,this->p,0.0,1.0);
    return;
  }
  pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_58,
             "ChFunctionRotation_spline::SetupData requires at least order+1 control points.",
             &local_79);
  ChException::ChException(pCVar2,&local_58);
  __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

void ChFunctionRotation_spline::SetupData(
    int morder,                         ///< order p: 1= linear, 2=quadratic, etc.
    const std::vector<ChQuaternion<> >& mrotations,  ///< rotation control points, size n. Required: at least n >= p+1
    ChVectorDynamic<>* mknots           ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
) {
    if (morder < 1)
        throw ChException("ChFunctionRotation_spline::SetupData requires order >= 1.");

    if (mrotations.size() < morder + 1)
        throw ChException("ChFunctionRotation_spline::SetupData requires at least order+1 control points.");

    if (mknots && mknots->size() != (mrotations.size() + morder + 1))
        throw ChException("ChFunctionRotation_spline::SetupData: knots must have size=n_points+order+1");

    this->p = morder;
    this->rotations = mrotations;
    int n = (int)rotations.size();

    if (mknots)
        this->knots = *mknots;
    else {
        this->knots.setZero(n + p + 1);
        geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
    }
}